

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O3

int __thiscall
icu_63::HebrewCalendar::clone
          (HebrewCalendar *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  Calendar *this_00;
  
  this_00 = (Calendar *)UMemory::operator_new((UMemory *)0x268,(size_t)__fn);
  if (this_00 != (Calendar *)0x0) {
    Calendar::Calendar(this_00,&this->super_Calendar);
    (this_00->super_UObject)._vptr_UObject = (_func_int **)&PTR__HebrewCalendar_003a3000;
  }
  return (int)this_00;
}

Assistant:

Calendar* HebrewCalendar::clone() const {
    return new HebrewCalendar(*this);
}